

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3EvalPhraseMergeToken(Fts3Table *pTab,Fts3Phrase *p,int iToken,char *pList,int nList)

{
  int *in_RCX;
  int in_EDX;
  long *in_RSI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  int unaff_retaddr;
  int nDiff;
  int nLeft;
  char *pLeft;
  int rc;
  int nRight;
  char *pRight;
  int local_40;
  undefined4 local_14;
  char **paRight;
  
  paRight = *(char ***)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  if (in_RCX == (int *)0x0) {
    sqlite3_free((void *)0x24e457);
    *in_RSI = 0;
    *(undefined4 *)(in_RSI + 1) = 0;
  }
  else if (*(int *)((long)in_RSI + 0x3c) < 0) {
    *in_RSI = (long)in_RCX;
    *(undefined4 *)(in_RSI + 1) = in_R8D;
  }
  else if (*in_RSI == 0) {
    sqlite3_free((void *)0x24e4b2);
  }
  else {
    local_14 = in_R8D;
    if (in_EDX <= *(int *)((long)in_RSI + 0x3c)) {
      in_RCX = (int *)*in_RSI;
      local_14 = (undefined4)in_RSI[1];
    }
    local_40 = fts3DoclistPhraseMerge(pLeft._4_4_,(int)pLeft,_nDiff,unaff_retaddr,paRight,in_RCX);
    sqlite3_free((void *)0x24e5a9);
    *in_RSI = (long)in_RCX;
    *(undefined4 *)(in_RSI + 1) = local_14;
  }
  if (*(int *)((long)in_RSI + 0x3c) < in_EDX) {
    *(int *)((long)in_RSI + 0x3c) = in_EDX;
  }
  if (*(char ***)(in_FS_OFFSET + 0x28) != paRight) {
    __stack_chk_fail();
  }
  return local_40;
}

Assistant:

static int fts3EvalPhraseMergeToken(
  Fts3Table *pTab,                /* FTS Table pointer */
  Fts3Phrase *p,                  /* Phrase to merge pList/nList into */
  int iToken,                     /* Token pList/nList corresponds to */
  char *pList,                    /* Pointer to doclist */
  int nList                       /* Number of bytes in pList */
){
  int rc = SQLITE_OK;
  assert( iToken!=p->iDoclistToken );

  if( pList==0 ){
    sqlite3_free(p->doclist.aAll);
    p->doclist.aAll = 0;
    p->doclist.nAll = 0;
  }

  else if( p->iDoclistToken<0 ){
    p->doclist.aAll = pList;
    p->doclist.nAll = nList;
  }

  else if( p->doclist.aAll==0 ){
    sqlite3_free(pList);
  }

  else {
    char *pLeft;
    char *pRight;
    int nLeft;
    int nRight;
    int nDiff;

    if( p->iDoclistToken<iToken ){
      pLeft = p->doclist.aAll;
      nLeft = p->doclist.nAll;
      pRight = pList;
      nRight = nList;
      nDiff = iToken - p->iDoclistToken;
    }else{
      pRight = p->doclist.aAll;
      nRight = p->doclist.nAll;
      pLeft = pList;
      nLeft = nList;
      nDiff = p->iDoclistToken - iToken;
    }

    rc = fts3DoclistPhraseMerge(
        pTab->bDescIdx, nDiff, pLeft, nLeft, &pRight, &nRight
    );
    sqlite3_free(pLeft);
    p->doclist.aAll = pRight;
    p->doclist.nAll = nRight;
  }

  if( iToken>p->iDoclistToken ) p->iDoclistToken = iToken;
  return rc;
}